

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.cpp
# Opt level: O2

ktx_error_code_e
ktxUncompressZLIBInt(uchar *pDest,ktx_size_t *pDestLength,uchar *pSrc,ktx_size_t srcLength)

{
  int iVar1;
  ktx_error_code_e kVar2;
  mz_ulong mzUncompressedSize;
  
  mzUncompressedSize = *pDestLength;
  if ((mzUncompressedSize | srcLength) >> 0x20 == 0) {
    iVar1 = buminiz::mz_uncompress(pDest,&mzUncompressedSize,pSrc,srcLength);
    if (iVar1 == -5) {
      kVar2 = KTX_DECOMPRESS_LENGTH_ERROR;
    }
    else if (iVar1 == -4) {
      kVar2 = KTX_OUT_OF_MEMORY;
    }
    else if (iVar1 == 0) {
      *pDestLength = mzUncompressedSize;
      kVar2 = KTX_SUCCESS;
    }
    else {
      kVar2 = KTX_FILE_DATA_ERROR;
    }
  }
  else {
    kVar2 = KTX_INVALID_VALUE;
  }
  return kVar2;
}

Assistant:

KTX_error_code ktxUncompressZLIBInt(unsigned char* pDest,
                                    ktx_size_t* pDestLength,
                                    const unsigned char* pSrc,
                                    ktx_size_t srcLength) {
    if ((srcLength | *pDestLength) > 0xFFFFFFFFU) return KTX_INVALID_VALUE;
    mz_ulong mzUncompressedSize = (mz_ulong)*pDestLength;
    int status = mz_uncompress(pDest, &mzUncompressedSize, pSrc, (mz_ulong)srcLength);
    switch (status) {
    case MZ_OK:
        *pDestLength = mzUncompressedSize;
        return KTX_SUCCESS;
    case MZ_BUF_ERROR:
        return KTX_DECOMPRESS_LENGTH_ERROR; // buffer too small
    case MZ_MEM_ERROR:
        return KTX_OUT_OF_MEMORY;
    default:
        return KTX_FILE_DATA_ERROR;
    }
}